

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_avl.c
# Opt level: O2

int main(int argc,char **argv)

{
  list_entity **pplVar1;
  list_entity *plVar2;
  tree_element *ptVar3;
  list_entity *plVar4;
  long lVar5;
  list_entity **pplVar6;
  list_entity **pplVar7;
  list_entity *plVar8;
  char *pcVar9;
  tree_element *ptVar10;
  list_entity **pplVar11;
  int iVar12;
  int line;
  tree_element *ptVar13;
  tree_element *ptVar14;
  uint32_t uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  bool bVar22;
  uint32_t array [1000];
  
  BEGIN_TESTING(clear_elements);
  do_tests(false);
  do_tests(true);
  srand(0);
  cunit_start_test("test_random_insert");
  avl_init(&head,avl_comp_uint32,1);
  random_insert(array,1000);
  random_delete(array,500);
  random_insert(array,400);
  random_delete(array,600);
  plVar8 = head.list_head.next;
  pplVar7 = &(head.list_head.next)->next;
  head.list_head.prev = &head.list_head;
  head.list_head.next = &head.list_head;
  head.root = (avl_node *)0x0;
  plVar2 = *pplVar7;
  for (; plVar4 = plVar2, head.count != 0; head.count = head.count - 1) {
    free(&plVar8[-1].prev);
    plVar2 = plVar4->next;
    plVar8 = plVar4;
  }
  cunit_end_test("test_random_insert");
  cunit_start_test("test_for_each_key_macro");
  avl_init(&head,avl_comp_uint32,1);
  array[0] = 3;
  lVar5 = avl_find();
  pplVar7 = (list_entity **)(lVar5 + -8);
  pplVar6 = pplVar7;
  if (lVar5 == 0) {
    pplVar7 = (list_entity **)0x0;
    pplVar6 = pplVar7;
  }
  for (; ((pplVar7 != (list_entity **)0x0 && ((avl_tree *)(pplVar7 + 1) != &head)) &&
         ((pplVar7 == pplVar6 || (*(char *)((long)pplVar7 + 0x39) == '\x01'))));
      pplVar7 = &(((avl_tree *)(pplVar7 + 1))->list_head).next[-1].prev) {
    cunit_named_check(false,"test_for_each_key_macro",0x282,
                      "elements returned by loop over empty tree");
  }
  nodes[3].node.key = nodes + 3;
  avl_insert(&head,0x1081b8);
  uVar15 = 4;
  additional_node1.node.key = &additional_node1;
  additional_node1.value = uVar15;
  avl_insert(&head,0x108278);
  additional_node2.node.key = &additional_node2;
  additional_node2.value = uVar15;
  avl_insert(&head,0x1082b8);
  array[0] = uVar15;
  lVar5 = avl_find(&head);
  ptVar10 = (tree_element *)(lVar5 + -8);
  if (lVar5 == 0) {
    ptVar10 = (tree_element *)0x0;
  }
  uVar19 = 0;
  uVar18 = 0;
  uVar17 = 0;
  iVar16 = 0;
  for (ptVar13 = ptVar10;
      ((ptVar13 != (tree_element *)0x0 && (&ptVar13->node != (avl_node *)&head)) &&
      ((ptVar13 == ptVar10 || ((ptVar13->node).follower == true))));
      ptVar13 = (tree_element *)&(ptVar13->node).list.next[-1].prev) {
    if (ptVar13 == (tree_element *)0x1081b0) {
      uVar19 = uVar19 + 1;
    }
    else if (ptVar13 == &additional_node1) {
      uVar18 = uVar18 + 1;
    }
    else if (ptVar13 == &additional_node2) {
      uVar17 = uVar17 + 1;
    }
    else {
      iVar16 = iVar16 + 1;
    }
  }
  uVar21 = 0;
  cunit_named_check(uVar19 != 0,"test_for_each_key_macro",0x2a8,"First node with key=4 not returned"
                   );
  cunit_named_check(uVar19 < 2,"test_for_each_key_macro",0x2a9,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar18 != 0,"test_for_each_key_macro",0x2aa,"First node with key=4 not returned"
                   );
  cunit_named_check(uVar18 < 2,"test_for_each_key_macro",0x2ab,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar17 != 0,"test_for_each_key_macro",0x2ac,"First node with key=4 not returned"
                   );
  cunit_named_check(uVar17 < 2,"test_for_each_key_macro",0x2ad,
                    "First node with key=4 returned multiple times");
  cunit_named_check(iVar16 == 0,"test_for_each_key_macro",0x2af,"Unknown node returned");
  nodes[2].node.key = nodes + 2;
  avl_insert(&head,0x108178);
  array[0] = 4;
  lVar5 = avl_find(&head);
  ptVar10 = (tree_element *)(lVar5 + -8);
  if (lVar5 == 0) {
    ptVar10 = (tree_element *)0x0;
  }
  uVar17 = 0;
  uVar18 = 0;
  iVar16 = 0;
  for (ptVar13 = ptVar10;
      ((ptVar13 != (tree_element *)0x0 && (&ptVar13->node != (avl_node *)&head)) &&
      ((ptVar13 == ptVar10 || ((ptVar13->node).follower == true))));
      ptVar13 = (tree_element *)&(ptVar13->node).list.next[-1].prev) {
    if (ptVar13 == (tree_element *)0x1081b0) {
      uVar21 = uVar21 + 1;
    }
    else if (ptVar13 == &additional_node1) {
      uVar17 = uVar17 + 1;
    }
    else if (ptVar13 == &additional_node2) {
      uVar18 = uVar18 + 1;
    }
    else {
      iVar16 = iVar16 + 1;
    }
  }
  uVar19 = 0;
  cunit_named_check(uVar21 != 0,"test_for_each_key_macro",0x2cb,"First node with key=4 not returned"
                   );
  cunit_named_check(uVar21 < 2,"test_for_each_key_macro",0x2cc,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar17 != 0,"test_for_each_key_macro",0x2cd,"First node with key=4 not returned"
                   );
  cunit_named_check(uVar17 < 2,"test_for_each_key_macro",0x2ce,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar18 != 0,"test_for_each_key_macro",0x2cf,"First node with key=4 not returned"
                   );
  cunit_named_check(uVar18 < 2,"test_for_each_key_macro",0x2d0,
                    "First node with key=4 returned multiple times");
  cunit_named_check(iVar16 == 0,"test_for_each_key_macro",0x2d2,"Unknown node returned");
  nodes[4].node.key = nodes + 4;
  avl_insert(&head,0x1081f8);
  array[0] = 4;
  lVar5 = avl_find(&head);
  ptVar10 = (tree_element *)(lVar5 + -8);
  if (lVar5 == 0) {
    ptVar10 = (tree_element *)0x0;
  }
  uVar18 = 0;
  uVar17 = 0;
  iVar16 = 0;
  for (ptVar13 = ptVar10;
      ((ptVar13 != (tree_element *)0x0 && (&ptVar13->node != (avl_node *)&head)) &&
      ((ptVar13 == ptVar10 || ((ptVar13->node).follower == true))));
      ptVar13 = (tree_element *)&(ptVar13->node).list.next[-1].prev) {
    if (ptVar13 == (tree_element *)0x1081b0) {
      uVar19 = uVar19 + 1;
    }
    else if (ptVar13 == &additional_node1) {
      uVar18 = uVar18 + 1;
    }
    else if (ptVar13 == &additional_node2) {
      uVar17 = uVar17 + 1;
    }
    else {
      iVar16 = iVar16 + 1;
    }
  }
  cunit_named_check(uVar19 != 0,"test_for_each_key_macro",0x2ee,"First node with key=4 not returned"
                   );
  cunit_named_check(uVar19 < 2,"test_for_each_key_macro",0x2ef,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar18 != 0,"test_for_each_key_macro",0x2f0,"First node with key=4 not returned"
                   );
  cunit_named_check(uVar18 < 2,"test_for_each_key_macro",0x2f1,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar17 != 0,"test_for_each_key_macro",0x2f2,"First node with key=4 not returned"
                   );
  cunit_named_check(uVar17 < 2,"test_for_each_key_macro",0x2f3,
                    "First node with key=4 returned multiple times");
  cunit_named_check(iVar16 == 0,"test_for_each_key_macro",0x2f5,"Unknown node returned");
  array[0] = 3;
  lVar5 = avl_find();
  pplVar7 = (list_entity **)(lVar5 + -8);
  if (lVar5 == 0) {
    pplVar7 = (list_entity **)0x0;
  }
  iVar16 = 0;
  for (pplVar6 = pplVar7;
      ((pplVar6 != (list_entity **)0x0 && ((avl_tree *)(pplVar6 + 1) != &head)) &&
      ((pplVar6 == pplVar7 || (*(char *)((long)pplVar6 + 0x39) == '\x01'))));
      pplVar6 = &(((avl_tree *)(pplVar6 + 1))->list_head).next[-1].prev) {
    bVar22 = iVar16 != 0;
    iVar16 = iVar16 + -1;
    if (bVar22) {
      iVar12 = 0x301;
      pcVar9 = "More than one element with key=3 returned";
    }
    else {
      iVar12 = 0x2fe;
      pcVar9 = "First node with key=3 not returned first";
    }
    cunit_named_check(!bVar22 && pplVar6 == (list_entity **)0x108170,"test_for_each_key_macro",
                      iVar12,pcVar9);
  }
  cunit_named_check(iVar16 != 0,"test_for_each_key_macro",0x306,"Less than one nodes returned");
  array[0] = 6;
  lVar5 = avl_find();
  pplVar7 = (list_entity **)(lVar5 + -8);
  pplVar6 = pplVar7;
  if (lVar5 == 0) {
    pplVar7 = (list_entity **)0x0;
    pplVar6 = pplVar7;
  }
  for (; ((pplVar7 != (list_entity **)0x0 && ((avl_tree *)(pplVar7 + 1) != &head)) &&
         ((pplVar7 == pplVar6 || (*(char *)((long)pplVar7 + 0x39) == '\x01'))));
      pplVar7 = &(((avl_tree *)(pplVar7 + 1))->list_head).next[-1].prev) {
    cunit_named_check(false,"test_for_each_key_macro",0x30a,
                      "Element returned by loop over non-existing key");
  }
  cunit_end_test("test_for_each_key_macro");
  cunit_start_test("test_for_each_key_safe_macro1");
  avl_init(&head,avl_comp_uint32,1);
  array[0] = 3;
  plVar8 = (list_entity *)avl_find();
  pplVar7 = &plVar8[-1].prev;
  pplVar6 = (list_entity **)0x0;
  if (plVar8 == (list_entity *)0x0) {
    pplVar11 = (list_entity **)0x0;
    pplVar1 = (list_entity **)0x0;
  }
  else {
    pplVar11 = pplVar7;
    pplVar1 = pplVar7;
    if (head.list_head.prev != plVar8) goto LAB_001019d5;
  }
  while (((pplVar7 = pplVar6, pplVar11 != (list_entity **)0x0 &&
          (pplVar11 != (list_entity **)0x1080b8)) &&
         ((pplVar11 == pplVar1 || (*(char *)((long)pplVar11 + 0x39) == '\x01'))))) {
    cunit_named_check(false,"test_for_each_key_safe_macro1",0x31c,
                      "elements returned by loop over empty tree");
    plVar8 = (list_entity *)(pplVar7 + 1);
LAB_001019d5:
    pplVar11 = pplVar7;
    pplVar6 = &plVar8->next[-1].prev;
  }
  nodes[3].node.key = nodes + 3;
  avl_insert(&head,0x1081b8);
  uVar15 = 4;
  additional_node1.node.key = &additional_node1;
  additional_node1.value = uVar15;
  avl_insert(&head,0x108278);
  additional_node2.node.key = &additional_node2;
  additional_node2.value = uVar15;
  avl_insert(&head,0x1082b8);
  array[0] = uVar15;
  plVar8 = (list_entity *)avl_find(&head);
  ptVar10 = (tree_element *)&plVar8[-1].prev;
  uVar17 = 0;
  if (plVar8 == (list_entity *)0x0) {
    iVar16 = 0;
    ptVar14 = (tree_element *)0x0;
    ptVar10 = (tree_element *)0x0;
    uVar17 = 0;
    ptVar13 = (tree_element *)0x0;
    uVar18 = 0;
    uVar19 = 0;
  }
  else {
    uVar21 = 0;
    uVar20 = 0;
    iVar12 = 0;
    iVar16 = 0;
    ptVar14 = (tree_element *)0x0;
    ptVar13 = ptVar10;
    uVar18 = 0;
    uVar19 = 0;
    if (head.list_head.prev != plVar8) goto LAB_00101b04;
  }
  while (((uVar20 = uVar19, uVar21 = uVar18, ptVar10 != (tree_element *)0x0 &&
          (ptVar10 != (tree_element *)0x1080b8)) &&
         ((ptVar10 == ptVar13 || ((ptVar10->node).follower == true))))) {
    iVar12 = iVar16;
    if (ptVar10 == nodes + 3) {
      uVar17 = uVar17 + 1;
    }
    else if (ptVar10 == &additional_node1) {
      uVar21 = uVar21 + 1;
    }
    else if (ptVar10 == &additional_node2) {
      uVar20 = uVar20 + 1;
    }
    else {
      iVar12 = iVar16 + 1;
    }
    plVar8 = &(ptVar14->node).list;
    ptVar10 = ptVar14;
LAB_00101b04:
    ptVar14 = (tree_element *)&((list_entity *)&plVar8->next)->next[-1].prev;
    iVar16 = iVar12;
    uVar18 = uVar21;
    uVar19 = uVar20;
  }
  uVar18 = 0;
  cunit_named_check(uVar17 != 0,"test_for_each_key_safe_macro1",0x342,
                    "First node with key=4 not returned");
  cunit_named_check(uVar17 < 2,"test_for_each_key_safe_macro1",0x343,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar21 != 0,"test_for_each_key_safe_macro1",0x344,
                    "First node with key=4 not returned");
  cunit_named_check(uVar21 < 2,"test_for_each_key_safe_macro1",0x345,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar20 != 0,"test_for_each_key_safe_macro1",0x346,
                    "First node with key=4 not returned");
  cunit_named_check(uVar20 < 2,"test_for_each_key_safe_macro1",0x347,
                    "First node with key=4 returned multiple times");
  cunit_named_check(iVar16 == 0,"test_for_each_key_safe_macro1",0x349,"Unknown node returned");
  nodes[2].node.key = nodes + 2;
  avl_insert(&head,0x108178);
  array[0] = 4;
  plVar8 = (list_entity *)avl_find(&head);
  ptVar10 = (tree_element *)&plVar8[-1].prev;
  if (plVar8 == (list_entity *)0x0) {
    iVar16 = 0;
    ptVar14 = (tree_element *)0x0;
    ptVar10 = (tree_element *)0x0;
    uVar18 = 0;
    ptVar13 = (tree_element *)0x0;
    uVar17 = 0;
    uVar19 = 0;
  }
  else {
    uVar21 = 0;
    uVar20 = 0;
    iVar16 = 0;
    ptVar14 = (tree_element *)0x0;
    iVar12 = 0;
    ptVar13 = ptVar10;
    uVar17 = 0;
    uVar19 = 0;
    if (head.list_head.prev != plVar8) goto LAB_00101ceb;
  }
  while (((uVar20 = uVar19, uVar21 = uVar17, ptVar10 != (tree_element *)0x0 &&
          (ptVar10 != (tree_element *)0x1080b8)) &&
         ((ptVar10 == ptVar13 || ((ptVar10->node).follower == true))))) {
    if (ptVar10 == nodes + 3) {
      uVar18 = uVar18 + 1;
    }
    else if (ptVar10 == &additional_node1) {
      uVar21 = uVar21 + 1;
    }
    else if (ptVar10 == &additional_node2) {
      uVar20 = uVar20 + 1;
    }
    else {
      iVar16 = iVar16 + 1;
    }
    plVar8 = &(ptVar14->node).list;
    ptVar10 = ptVar14;
    iVar12 = iVar16;
LAB_00101ceb:
    iVar16 = iVar12;
    ptVar14 = (tree_element *)&((list_entity *)&plVar8->next)->next[-1].prev;
    uVar17 = uVar21;
    uVar19 = uVar20;
  }
  uVar17 = 0;
  cunit_named_check(uVar18 != 0,"test_for_each_key_safe_macro1",0x365,
                    "First node with key=4 not returned");
  cunit_named_check(uVar18 < 2,"test_for_each_key_safe_macro1",0x366,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar21 != 0,"test_for_each_key_safe_macro1",0x367,
                    "First node with key=4 not returned");
  cunit_named_check(uVar21 < 2,"test_for_each_key_safe_macro1",0x368,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar20 != 0,"test_for_each_key_safe_macro1",0x369,
                    "First node with key=4 not returned");
  cunit_named_check(uVar20 < 2,"test_for_each_key_safe_macro1",0x36a,
                    "First node with key=4 returned multiple times");
  cunit_named_check(iVar16 == 0,"test_for_each_key_safe_macro1",0x36c,"Unknown node returned");
  nodes[4].node.key = nodes + 4;
  avl_insert(&head,0x1081f8);
  array[0] = 4;
  plVar8 = (list_entity *)avl_find(&head);
  ptVar10 = (tree_element *)&plVar8[-1].prev;
  if (plVar8 == (list_entity *)0x0) {
    iVar16 = 0;
    ptVar14 = (tree_element *)0x0;
    ptVar10 = (tree_element *)0x0;
    uVar17 = 0;
    ptVar13 = (tree_element *)0x0;
    uVar18 = 0;
    uVar19 = 0;
  }
  else {
    uVar21 = 0;
    uVar20 = 0;
    iVar16 = 0;
    ptVar14 = (tree_element *)0x0;
    iVar12 = 0;
    ptVar13 = ptVar10;
    uVar18 = 0;
    uVar19 = 0;
    if (head.list_head.prev != plVar8) goto LAB_00101ed2;
  }
  while (((uVar20 = uVar19, uVar21 = uVar18, ptVar10 != (tree_element *)0x0 &&
          (ptVar10 != (tree_element *)0x1080b8)) &&
         ((ptVar10 == ptVar13 || ((ptVar10->node).follower == true))))) {
    if (ptVar10 == nodes + 3) {
      uVar17 = uVar17 + 1;
    }
    else if (ptVar10 == &additional_node1) {
      uVar21 = uVar21 + 1;
    }
    else if (ptVar10 == &additional_node2) {
      uVar20 = uVar20 + 1;
    }
    else {
      iVar16 = iVar16 + 1;
    }
    plVar8 = &(ptVar14->node).list;
    ptVar10 = ptVar14;
    iVar12 = iVar16;
LAB_00101ed2:
    iVar16 = iVar12;
    ptVar14 = (tree_element *)&((list_entity *)&plVar8->next)->next[-1].prev;
    uVar18 = uVar21;
    uVar19 = uVar20;
  }
  iVar12 = 0;
  cunit_named_check(uVar17 != 0,"test_for_each_key_safe_macro1",0x388,
                    "First node with key=4 not returned");
  cunit_named_check(uVar17 < 2,"test_for_each_key_safe_macro1",0x389,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar21 != 0,"test_for_each_key_safe_macro1",0x38a,
                    "First node with key=4 not returned");
  cunit_named_check(uVar21 < 2,"test_for_each_key_safe_macro1",0x38b,
                    "First node with key=4 returned multiple times");
  cunit_named_check(uVar20 != 0,"test_for_each_key_safe_macro1",0x38c,
                    "First node with key=4 not returned");
  cunit_named_check(uVar20 < 2,"test_for_each_key_safe_macro1",0x38d,
                    "First node with key=4 returned multiple times");
  cunit_named_check(iVar16 == 0,"test_for_each_key_safe_macro1",0x38f,"Unknown node returned");
  array[0] = 3;
  plVar8 = (list_entity *)avl_find();
  ptVar10 = (tree_element *)&plVar8[-1].prev;
  if (plVar8 == (list_entity *)0x0) {
    ptVar14 = (tree_element *)0x0;
    ptVar3 = (tree_element *)0x0;
    iVar12 = 0;
    ptVar13 = (tree_element *)0x0;
  }
  else {
    ptVar14 = ptVar10;
    ptVar3 = (tree_element *)0x0;
    iVar16 = iVar12;
    ptVar13 = ptVar10;
    if (head.list_head.prev != plVar8) goto LAB_00102058;
  }
  while (((ptVar10 = ptVar3, ptVar14 != (tree_element *)0x0 && (ptVar14 != (tree_element *)0x1080b8)
          ) && ((ptVar14 == ptVar13 || ((ptVar14->node).follower == true))))) {
    iVar16 = iVar12 + 1;
    if (iVar12 == 0) {
      pcVar9 = "First node with key=3 not returned first";
      line = 0x398;
    }
    else {
      pcVar9 = "More than one element with key=3 returned";
      line = 0x39b;
    }
    cunit_named_check(iVar12 == 0 && ptVar14 == nodes + 2,"test_for_each_key_safe_macro1",line,
                      pcVar9);
    plVar8 = &(ptVar10->node).list;
LAB_00102058:
    ptVar14 = ptVar10;
    ptVar3 = (tree_element *)&((list_entity *)&plVar8->next)->next[-1].prev;
    iVar12 = iVar16;
  }
  cunit_named_check(iVar12 != 0,"test_for_each_key_safe_macro1",0x3a0,"Less than one nodes returned"
                   );
  array[0] = 6;
  plVar8 = (list_entity *)avl_find();
  pplVar7 = &plVar8[-1].prev;
  pplVar6 = (list_entity **)0x0;
  if (plVar8 == (list_entity *)0x0) {
    pplVar11 = (list_entity **)0x0;
    pplVar1 = (list_entity **)0x0;
  }
  else {
    pplVar11 = pplVar7;
    pplVar1 = pplVar7;
    if (head.list_head.prev != plVar8) goto LAB_00102125;
  }
  while (((pplVar7 = pplVar6, pplVar11 != (list_entity **)0x0 &&
          (pplVar11 != (list_entity **)0x1080b8)) &&
         ((pplVar11 == pplVar1 || (*(char *)((long)pplVar11 + 0x39) == '\x01'))))) {
    cunit_named_check(false,"test_for_each_key_safe_macro1",0x3a4,
                      "Element returned by loop over non-existing key");
    plVar8 = (list_entity *)(pplVar7 + 1);
LAB_00102125:
    pplVar11 = pplVar7;
    pplVar6 = &plVar8->next[-1].prev;
  }
  cunit_end_test("test_for_each_key_safe_macro1");
  iVar16 = FINISH_TESTING();
  return iVar16;
}

Assistant:

int main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  BEGIN_TESTING(clear_elements);

  do_tests(false);
  do_tests(true);
  test_random_insert();
  test_for_each_key_macro();
  test_for_each_key_safe_macro1();

  //TODO: test removal in for_each_key_safe

  return FINISH_TESTING();
}